

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Add_patch(void *alpha,int g_a,int *alo,int *ahi,void *beta,int g_b,int *blo,int *bhi,
                  int g_c,int *clo,int *chi)

{
  Integer in_RCX;
  long in_RDX;
  int in_ESI;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  long in_stack_00000020;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer cndim;
  Integer c;
  Integer bndim;
  Integer b;
  Integer andim;
  Integer a;
  Integer in_stack_00000b20;
  void *in_stack_00000b28;
  Integer *in_stack_00000b30;
  Integer *in_stack_00000b38;
  Integer in_stack_00000b40;
  void *in_stack_00000b48;
  Integer *in_stack_00000b60;
  Integer *in_stack_00000b68;
  Integer in_stack_00000b70;
  Integer *in_stack_00000b78;
  Integer *in_stack_00000b80;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  long local_1e8 [8];
  long local_1a8 [8];
  long local_168 [8];
  long local_128 [8];
  long local_e8 [8];
  long local_a8 [7];
  Integer local_70;
  long local_68;
  Integer local_60;
  long local_58;
  Integer local_50;
  long local_48;
  int local_3c;
  
  local_48 = (long)in_ESI;
  local_3c = in_R9D;
  local_50 = pnga_ndim(in_RCX);
  local_58 = (long)local_3c;
  local_60 = pnga_ndim(in_RCX);
  local_68 = (long)in_stack_00000018;
  local_70 = pnga_ndim(in_RCX);
  for (local_1ec = 0; local_1ec < local_50; local_1ec = local_1ec + 1) {
    local_a8[(local_50 - local_1ec) + -1] = (long)*(int *)(in_RDX + (long)local_1ec * 4) + 1;
  }
  for (local_1f0 = 0; local_1f0 < local_50; local_1f0 = local_1f0 + 1) {
    local_e8[(local_50 - local_1f0) + -1] = (long)*(int *)(in_RCX + (long)local_1f0 * 4) + 1;
  }
  for (local_1f4 = 0; local_1f4 < local_60; local_1f4 = local_1f4 + 1) {
    local_128[(local_60 - local_1f4) + -1] =
         (long)*(int *)(in_stack_00000008 + (long)local_1f4 * 4) + 1;
  }
  for (local_1f8 = 0; local_1f8 < local_60; local_1f8 = local_1f8 + 1) {
    local_168[(local_60 - local_1f8) + -1] =
         (long)*(int *)(in_stack_00000010 + (long)local_1f8 * 4) + 1;
  }
  for (local_1fc = 0; local_1fc < local_70; local_1fc = local_1fc + 1) {
    local_1a8[(local_70 - local_1fc) + -1] =
         (long)*(int *)(in_stack_00000020 + (long)local_1fc * 4) + 1;
  }
  for (local_200 = 0; local_200 < local_70; local_200 = local_200 + 1) {
    local_1e8[(local_70 - local_200) + -1] = (long)*(int *)(_i_5 + (long)local_200 * 4) + 1;
  }
  pnga_add_patch(in_stack_00000b48,in_stack_00000b40,in_stack_00000b38,in_stack_00000b30,
                 in_stack_00000b28,in_stack_00000b20,in_stack_00000b60,in_stack_00000b68,
                 in_stack_00000b70,in_stack_00000b78,in_stack_00000b80);
  return;
}

Assistant:

void NGA_Add_patch(void * alpha, int g_a, int alo[], int ahi[],
                   void * beta,  int g_b, int blo[], int bhi[],
                   int g_c, int clo[], int chi[])
{
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);

    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);

    Integer c=(Integer)g_c;
    Integer cndim = wnga_ndim(c);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];

    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);

    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);

    wnga_add_patch(alpha, a, _ga_alo, _ga_ahi, beta, b, _ga_blo, _ga_bhi,
                   c, _ga_clo, _ga_chi);
}